

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O0

int __thiscall Fl_Tree_Item::depth(Fl_Tree_Item *this)

{
  undefined8 local_20;
  Fl_Tree_Item *item;
  int count;
  Fl_Tree_Item *this_local;
  
  item._4_4_ = 0;
  for (local_20 = parent(this); local_20 != (Fl_Tree_Item *)0x0; local_20 = parent(local_20)) {
    item._4_4_ = item._4_4_ + 1;
  }
  return item._4_4_;
}

Assistant:

int Fl_Tree_Item::depth() const {
  int count = 0;
  const Fl_Tree_Item *item = parent();
  while ( item ) {
    ++count;
    item = item->parent();
  }
  return(count);
}